

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.h
# Opt level: O0

QCborValue * __thiscall QCborMap::value(QCborMap *this,QLatin1StringView key)

{
  long lVar1;
  QLatin1StringView key_00;
  bool bVar2;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QCborValueConstRef *in_stack_ffffffffffffff78;
  QCborValue *this_00;
  qsizetype in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_00.m_data = in_stack_ffffffffffffffb8;
  key_00.m_size = in_stack_ffffffffffffffb0;
  this_00 = in_RDI;
  find((QCborMap *)in_RDI,key_00);
  end((QCborMap *)0x44ae96);
  bVar2 = ::comparesEqual((ConstIterator *)in_RDI,(ConstIterator *)in_stack_ffffffffffffff78);
  if (bVar2) {
    ::QCborValue::QCborValue((QCborValue *)in_RDI);
  }
  else {
    ConstIterator::value((ConstIterator *)this_00);
    QCborValueConstRef::operator_cast_to_QCborValue(in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue value(const QString & key) const
    { const_iterator it = find(key); return comparesEqual(it, end()) ? QCborValue() : it.value(); }